

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O1

void Frc_ManPlaceDfs(Frc_Man_t *p,Vec_Int_t *vCoOrder)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  int local_2c;
  
  iVar2 = p->nObjData;
  if (iVar2 < 1) {
LAB_0073655b:
    local_2c = 0;
  }
  else {
    piVar4 = p->pObjData;
    iVar5 = 0;
    local_2c = 0;
    do {
      if (piVar4 == (int *)0x0) goto LAB_0073655b;
      iVar3 = piVar4[(long)iVar5 + 1];
      piVar4[(long)iVar5 + 2] = iVar3;
      if ((iVar3 == 0) && ((*(byte *)(piVar4 + iVar5) & 2) == 0)) {
        piVar4[(long)iVar5 + 4] = local_2c;
        local_2c = local_2c + 1;
      }
      iVar5 = iVar5 + iVar3 + ((uint)piVar4[iVar5] >> 4) + 6;
    } while (iVar5 < iVar2);
  }
  if (0 < vCoOrder->nSize) {
    lVar6 = 0;
    do {
      if (p->pObjData == (int *)0x0) break;
      pbVar1 = (byte *)(p->pObjData + vCoOrder->pArray[lVar6]);
      if ((*pbVar1 & 2) == 0) {
        __assert_fail("Frc_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                      ,0x343,"void Frc_ManPlaceDfs(Frc_Man_t *, Vec_Int_t *)");
      }
      Frc_ManPlaceDfs_rec(p,(Frc_Obj_t *)(pbVar1 + (long)*(int *)(pbVar1 + 0x18) * -4),&local_2c);
      iVar2 = local_2c + 1;
      *(int *)(pbVar1 + 0x10) = local_2c;
      lVar6 = lVar6 + 1;
      local_2c = iVar2;
    } while (lVar6 < vCoOrder->nSize);
  }
  if (local_2c != p->nObjs) {
    __assert_fail("nPlaces == p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                  ,0x347,"void Frc_ManPlaceDfs(Frc_Man_t *, Vec_Int_t *)");
  }
  return;
}

Assistant:

void Frc_ManPlaceDfs( Frc_Man_t * p, Vec_Int_t * vCoOrder )
{
    Frc_Obj_t * pObj;
    int i, nPlaces = 0;
    Frc_ManForEachObj( p, pObj, i )
    {
        pObj->iFanout = pObj->nFanouts;
        if ( pObj->nFanouts == 0 && !Frc_ObjIsCo(pObj) )
            pObj->pPlace = nPlaces++;
    }
    Frc_ManForEachObjVec( vCoOrder, p, pObj, i )
    {
        assert( Frc_ObjIsCo(pObj) );
        Frc_ManPlaceDfs_rec( p, Frc_ObjFanin(pObj,0), &nPlaces );
        pObj->pPlace = nPlaces++;
    }
    assert( nPlaces == p->nObjs );
}